

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# count_if_suite.cpp
# Opt level: O0

void count_array(void)

{
  size_type in_RCX;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  basic_variable<std::allocator<char>_> *local_5a0;
  undefined4 local_598 [2];
  iterator local_590;
  iterator local_578;
  difference_type local_560 [2];
  undefined4 local_550 [2];
  iterator local_548;
  iterator local_530;
  difference_type local_518 [2];
  undefined4 local_508 [2];
  iterator local_500;
  iterator local_4e8;
  difference_type local_4d0 [2];
  undefined4 local_4c0 [2];
  iterator local_4b8;
  iterator local_4a0;
  difference_type local_488 [2];
  undefined4 local_478 [2];
  iterator local_470;
  iterator local_458;
  difference_type local_440 [2];
  undefined4 local_430 [2];
  iterator local_428;
  iterator local_410;
  difference_type local_3f8 [2];
  undefined4 local_3e8 [2];
  iterator local_3e0;
  iterator local_3c8;
  difference_type local_3b0 [2];
  undefined4 local_3a0 [2];
  iterator local_398;
  iterator local_380;
  difference_type local_368 [2];
  undefined4 local_358 [2];
  iterator local_350;
  iterator local_338;
  difference_type local_320 [2];
  undefined4 local_310 [2];
  iterator local_308;
  iterator local_2f0;
  difference_type local_2d8 [2];
  undefined4 local_2c8 [2];
  iterator local_2c0;
  iterator local_2a8;
  difference_type local_290 [2];
  undefined4 local_280 [2];
  iterator local_278;
  iterator local_260;
  difference_type local_248 [2];
  undefined4 local_238 [2];
  iterator local_230;
  iterator local_218;
  difference_type local_200 [2];
  undefined4 local_1f0 [2];
  iterator local_1e8;
  iterator local_1d0;
  difference_type local_1b8 [3];
  basic_variable<std::allocator<char>_> *local_1a0;
  basic_variable<std::allocator<char>_> local_198;
  basic_variable<std::allocator<char>_> local_168;
  basic_variable<std::allocator<char>_> local_138;
  basic_variable<std::allocator<char>_> local_108;
  basic_variable<std::allocator<char>_> local_d8;
  basic_variable<std::allocator<char>_> local_a8;
  basic_variable<std::allocator<char>_> local_78;
  undefined1 local_48 [24];
  variable data;
  
  local_1a0 = &local_198;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(local_1a0,true);
  local_1a0 = &local_168;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_1a0,2);
  local_1a0 = &local_138;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(local_1a0,3.0);
  local_1a0 = &local_108;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_1a0,"alpha");
  local_1a0 = &local_d8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_1a0,L"bravo");
  local_1a0 = &local_a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_1a0,L"charlie");
  local_1a0 = &local_78;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_1a0,L"delta");
  local_48._0_8_ = &local_198;
  local_48._8_8_ = 7;
  init._M_len = in_RCX;
  init._M_array = (iterator)0x7;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
             (basic_array<std::allocator<char>_> *)local_48._0_8_,init);
  local_5a0 = (basic_variable<std::allocator<char>_> *)local_48;
  do {
    local_5a0 = local_5a0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_5a0);
  } while (local_5a0 != &local_198);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1d0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_1e8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_1b8[0] = std::
                 count_if<trial::dynamic::basic_variable<std::allocator<char>>::iterator,count_array()::__0>
                           (&local_1d0,&local_1e8);
  local_1f0[0] = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::count_if(data.begin(), data.end(), [] (const variable& value) { return value == true; })"
             ,"1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/count_if_suite.cpp"
             ,0x82,"void count_array()",local_1b8,local_1f0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1d0);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_218,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_230,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_200[0] = std::
                 count_if<trial::dynamic::basic_variable<std::allocator<char>>::iterator,count_array()::__1>
                           (&local_218,&local_230);
  local_238[0] = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::count_if(data.begin(), data.end(), [] (const variable& value) { return value == 2; })"
             ,"1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/count_if_suite.cpp"
             ,0x85,"void count_array()",local_200,local_238);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_230);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_218);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_260,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_278,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_248[0] = std::
                 count_if<trial::dynamic::basic_variable<std::allocator<char>>::iterator,count_array()::__2>
                           (&local_260,&local_278);
  local_280[0] = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::count_if(data.begin(), data.end(), [] (const variable& value) { return value == 3.0; })"
             ,"1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/count_if_suite.cpp"
             ,0x88,"void count_array()",local_248,local_280);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_278);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_260);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_2a8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_2c0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_290[0] = std::
                 count_if<trial::dynamic::basic_variable<std::allocator<char>>::iterator,count_array()::__3>
                           (&local_2a8,&local_2c0);
  local_2c8[0] = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::count_if(data.begin(), data.end(), [] (const variable& value) { return value == \"alpha\"; })"
             ,"1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/count_if_suite.cpp"
             ,0x8b,"void count_array()",local_290,local_2c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_2c0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_2a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_2f0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_308,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_2d8[0] = std::
                 count_if<trial::dynamic::basic_variable<std::allocator<char>>::iterator,count_array()::__4>
                           (&local_2f0,&local_308);
  local_310[0] = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::count_if(data.begin(), data.end(), [] (const variable& value) { return value == L\"bravo\"; })"
             ,"1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/count_if_suite.cpp"
             ,0x8e,"void count_array()",local_2d8,local_310);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_308);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_2f0);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_338,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_350,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_320[0] = std::
                 count_if<trial::dynamic::basic_variable<std::allocator<char>>::iterator,count_array()::__5>
                           (&local_338,&local_350);
  local_358[0] = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::count_if(data.begin(), data.end(), [] (const variable& value) { return value == u\"charlie\"; })"
             ,"1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/count_if_suite.cpp"
             ,0x91,"void count_array()",local_320,local_358);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_350);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_338);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_380,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_398,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_368[0] = std::
                 count_if<trial::dynamic::basic_variable<std::allocator<char>>::iterator,count_array()::__6>
                           (&local_380,&local_398);
  local_3a0[0] = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::count_if(data.begin(), data.end(), [] (const variable& value) { return value == U\"delta\"; })"
             ,"1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/count_if_suite.cpp"
             ,0x94,"void count_array()",local_368,local_3a0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_398);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_380);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_3c8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_3e0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_3b0[0] = std::
                 count_if<trial::dynamic::basic_variable<std::allocator<char>>::iterator,count_array()::__7>
                           (&local_3c8,&local_3e0);
  local_3e8[0] = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::count_if(data.begin(), data.end(), [] (const variable& value) { return value == false; })"
             ,"0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/count_if_suite.cpp"
             ,0x98,"void count_array()",local_3b0,local_3e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_3e0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_3c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_410,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_428,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_3f8[0] = std::
                 count_if<trial::dynamic::basic_variable<std::allocator<char>>::iterator,count_array()::__8>
                           (&local_410,&local_428);
  local_430[0] = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::count_if(data.begin(), data.end(), [] (const variable& value) { return value == 20; })"
             ,"0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/count_if_suite.cpp"
             ,0x9b,"void count_array()",local_3f8,local_430);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_428);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_410);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_458,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_470,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_440[0] = std::
                 count_if<trial::dynamic::basic_variable<std::allocator<char>>::iterator,count_array()::__9>
                           (&local_458,&local_470);
  local_478[0] = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::count_if(data.begin(), data.end(), [] (const variable& value) { return value == 300.0; })"
             ,"0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/count_if_suite.cpp"
             ,0x9e,"void count_array()",local_440,local_478);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_470);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_458);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_4a0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_4b8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_488[0] = std::
                 count_if<trial::dynamic::basic_variable<std::allocator<char>>::iterator,count_array()::__10>
                           (&local_4a0,&local_4b8);
  local_4c0[0] = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::count_if(data.begin(), data.end(), [] (const variable& value) { return value == \"zulu\"; })"
             ,"0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/count_if_suite.cpp"
             ,0xa1,"void count_array()",local_488,local_4c0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_4b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_4a0);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_4e8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_500,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_4d0[0] = std::
                 count_if<trial::dynamic::basic_variable<std::allocator<char>>::iterator,count_array()::__11>
                           (&local_4e8,&local_500);
  local_508[0] = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::count_if(data.begin(), data.end(), [] (const variable& value) { return value == L\"zulu\"; })"
             ,"0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/count_if_suite.cpp"
             ,0xa4,"void count_array()",local_4d0,local_508);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_500);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_4e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_530,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_548,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_518[0] = std::
                 count_if<trial::dynamic::basic_variable<std::allocator<char>>::iterator,count_array()::__12>
                           (&local_530,&local_548);
  local_550[0] = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::count_if(data.begin(), data.end(), [] (const variable& value) { return value == u\"zulu\"; })"
             ,"0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/count_if_suite.cpp"
             ,0xa7,"void count_array()",local_518,local_550);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_548);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_530);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_578,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_590,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_560[0] = std::
                 count_if<trial::dynamic::basic_variable<std::allocator<char>>::iterator,count_array()::__13>
                           (&local_578,&local_590);
  local_598[0] = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::count_if(data.begin(), data.end(), [] (const variable& value) { return value == U\"zulu\"; })"
             ,"0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/count_if_suite.cpp"
             ,0xaa,"void count_array()",local_560,local_598);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_590);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_578);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  return;
}

Assistant:

void count_array()
{
    variable data = array::make({ true, 2, 3.0, "alpha", L"bravo", u"charlie", U"delta" });
    TRIAL_PROTOCOL_TEST_EQUAL(std::count_if(data.begin(), data.end(),
                                            [] (const variable& value) { return value == true; }),
                              1);
    TRIAL_PROTOCOL_TEST_EQUAL(std::count_if(data.begin(), data.end(),
                                            [] (const variable& value) { return value == 2; }),
                              1);
    TRIAL_PROTOCOL_TEST_EQUAL(std::count_if(data.begin(), data.end(),
                                            [] (const variable& value) { return value == 3.0; }),
                              1);
    TRIAL_PROTOCOL_TEST_EQUAL(std::count_if(data.begin(), data.end(),
                                            [] (const variable& value) { return value == "alpha"; }),
                              1);
    TRIAL_PROTOCOL_TEST_EQUAL(std::count_if(data.begin(), data.end(),
                                            [] (const variable& value) { return value == L"bravo"; }),
                              1);
    TRIAL_PROTOCOL_TEST_EQUAL(std::count_if(data.begin(), data.end(),
                                            [] (const variable& value) { return value == u"charlie"; }),
                              1);
    TRIAL_PROTOCOL_TEST_EQUAL(std::count_if(data.begin(), data.end(),
                                            [] (const variable& value) { return value == U"delta"; }),
                              1);

    TRIAL_PROTOCOL_TEST_EQUAL(std::count_if(data.begin(), data.end(),
                                            [] (const variable& value) { return value == false; }),
                              0);
    TRIAL_PROTOCOL_TEST_EQUAL(std::count_if(data.begin(), data.end(),
                                            [] (const variable& value) { return value == 20; }),
                              0);
    TRIAL_PROTOCOL_TEST_EQUAL(std::count_if(data.begin(), data.end(),
                                            [] (const variable& value) { return value == 300.0; }),
                              0);
    TRIAL_PROTOCOL_TEST_EQUAL(std::count_if(data.begin(), data.end(),
                                            [] (const variable& value) { return value == "zulu"; }),
                              0);
    TRIAL_PROTOCOL_TEST_EQUAL(std::count_if(data.begin(), data.end(),
                                            [] (const variable& value) { return value == L"zulu"; }),
                              0);
    TRIAL_PROTOCOL_TEST_EQUAL(std::count_if(data.begin(), data.end(),
                                            [] (const variable& value) { return value == u"zulu"; }),
                              0);
    TRIAL_PROTOCOL_TEST_EQUAL(std::count_if(data.begin(), data.end(),
                                            [] (const variable& value) { return value == U"zulu"; }),
                              0);
}